

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O2

string * __thiscall
ser::FieldsTable::FieldFromJSON_abi_cxx11_
          (string *__return_storage_ptr__,FieldsTable *this,JSONNode *node)

{
  DataFieldInfo info;
  DataFieldInfo DStack_c8;
  
  DataFieldInfo::DataFieldInfo(&DStack_c8);
  DataFieldInfo::FromJSON(&DStack_c8,node);
  RegisterField(this,&DStack_c8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&DStack_c8);
  DataFieldInfo::~DataFieldInfo(&DStack_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldsTable::FieldFromJSON(const JSONNode& node)
{
    DataFieldInfo info;
    info.FromJSON(node);
    RegisterField(info);
    return info.name();
}